

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  byte *data;
  
  if (this->_processEntities != true) {
    Write(this,p);
    return;
  }
  data = (byte *)p;
  do {
    bVar1 = *p;
    if ((ulong)bVar1 == 0) {
      if (data < p) {
        sVar4 = (long)p - (long)data;
        if (0x7ffffffe < sVar4) {
          sVar4 = 0x7fffffff;
        }
        Write(this,(char *)data,sVar4);
        return;
      }
      return;
    }
    if ((bVar1 < 0x40) && (this->_entityFlag[(ulong)bVar1 + (ulong)restricted * 0x40] == true)) {
      for (; data < p; data = data + sVar4) {
        sVar4 = (long)p - (long)data;
        if (0x7ffffffe < sVar4) {
          sVar4 = 0x7fffffff;
        }
        Write(this,(char *)data,sVar4);
      }
      lVar2 = -0x10;
      do {
        lVar3 = lVar2;
        if (lVar3 + 0x10 == 0x50) goto LAB_0010ddc1;
        lVar2 = lVar3 + 0x10;
      } while ((&DAT_001155dc)[lVar3] != *p);
      Putc(this,'&');
      Write(this,*(char **)((long)&PTR_anon_var_dwarf_406e_001155d0 + lVar3),
            (long)*(int *)((long)&DAT_001155d8 + lVar3));
      Putc(this,';');
LAB_0010ddc1:
      data = data + 1;
    }
    p = (char *)((byte *)p + 1);
  } while( true );
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[(unsigned char)(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
                        Write( p, toPrint );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Putc( '&' );
                            Write( entities[i].pattern, entities[i].length );
                            Putc( ';' );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
        // Flush the remaining string. This will be the entire
        // string if an entity wasn't found.
        if ( p < q ) {
            const size_t delta = q - p;
            const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
            Write( p, toPrint );
        }
    }
    else {
        Write( p );
    }
}